

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>&>
          (FormatBuffer *this,text_style *style,format_string<std::basic_string_view<char>_&> fmt,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  basic_format_args<fmt::v11::context> args_00;
  basic_string_view<char> fmt_00;
  format_args args_01;
  string_view fmt_01;
  value<fmt::v11::context> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0;
  locale_ref local_d0;
  undefined1 local_c8 [16];
  char local_b8 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_b0;
  undefined1 local_80 [16];
  undefined1 *local_70;
  undefined1 *local_68;
  text_style *in_stack_ffffffffffffffa8;
  buffer<char> *in_stack_ffffffffffffffb0;
  unsigned_long_long in_stack_ffffffffffffffb8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffffc0;
  buffer<char> *in_stack_ffffffffffffffc8;
  locale_ref in_stack_ffffffffffffffd0;
  unsigned_long_long in_stack_ffffffffffffffd8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar1;
  char *pcVar2;
  size_t in_stack_fffffffffffffff0;
  
  if ((undefined1  [16])
      ((undefined1  [16])in_RDI[0x21].field_0.uint128_value & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_68 = local_80;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
    pcVar2 = local_b8;
    aVar1.values_ = (value<fmt::v11::context> *)local_c8;
    local_b8[0] = '\r';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b0.values_ = aVar1.values_;
    ::fmt::v11::detail::locale_ref::locale_ref(&local_d0);
    fmt_01.size_ = in_stack_fffffffffffffff0;
    fmt_01.data_ = pcVar2;
    args_01.field_1.values_ = aVar1.values_;
    args_01.desc_ = in_stack_ffffffffffffffd8;
    ::fmt::v11::detail::vformat_to
              (in_stack_ffffffffffffffc8,fmt_01,args_01,in_stack_ffffffffffffffd0);
  }
  else {
    local_70 = local_80;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_RDI,in_stack_fffffffffffffee8);
    local_f0 = local_108;
    local_f8 = 0xd;
    fmt_00.size_ = (size_t)in_stack_ffffffffffffffd0.locale_;
    fmt_00.data_ = (char *)in_stack_ffffffffffffffc8;
    args_00.field_1.values_ = in_stack_ffffffffffffffc0.values_;
    args_00.desc_ = in_stack_ffffffffffffffb8;
    ::fmt::v11::detail::vformat_to<char>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,fmt_00,args_00);
  }
  return;
}

Assistant:

void format(const fmt::text_style& style, fmt::format_string<Args...> fmt, Args&&... args) {
        if (!showColors) {
            fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
        }
        else {
            fmt::detail::vformat_to(buf, style, fmt::string_view(fmt),
                                    fmt::make_format_args(args...));
        }
    }